

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

void Omega_h::inertia::recursively_bisect
               (CommPtr *comm,Real tolerance,Reals *p_coords,Reals *p_masses,Remotes *p_owners,
               Rib *p_hints)

{
  pointer __src;
  pointer *ppVVar1;
  void **ppvVar2;
  int *piVar3;
  pointer __dest;
  pointer pVVar4;
  Alloc *pAVar5;
  Comm *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Vector<3> axis_00;
  element_type *peVar6;
  I32 IVar7;
  uint uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  Vector<3> axis;
  Dist dist;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  Dist local_1f8;
  CommPtr local_168;
  Alloc *local_158;
  void *local_150;
  Reals local_148;
  Reals local_138;
  CommPtr local_128;
  Remotes local_118;
  Vector<3> local_f8;
  Reals *local_d8;
  Reals *local_d0;
  Dist local_c8;
  
  local_1f8.roots2items_[1].write_.shared_alloc_.direct_ptr = (void *)tolerance;
  IVar7 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (IVar7 != 1) {
    __dest = (p_hints->axes).
             super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar4 = (p_hints->axes).
             super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__dest == pVVar4) {
      local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_1f8.items2content_[1].write_.shared_alloc_.alloc =
           (p_coords->write_).shared_alloc_.alloc;
      if (((ulong)local_1f8.items2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
          local_1f8.items2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1f8.items2content_[1].write_.shared_alloc_.alloc =
               (Alloc *)((local_1f8.items2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_1f8.items2content_[1].write_.shared_alloc_.alloc)->use_count =
               (local_1f8.items2content_[1].write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_1f8.items2content_[1].write_.shared_alloc_.direct_ptr =
           (p_coords->write_).shared_alloc_.direct_ptr;
      local_138.write_.shared_alloc_.alloc = (p_masses->write_).shared_alloc_.alloc;
      if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
          local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_138.write_.shared_alloc_.alloc =
               (Alloc *)((local_138.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_138.write_.shared_alloc_.alloc)->use_count =
               (local_138.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_138.write_.shared_alloc_.direct_ptr = (p_masses->write_).shared_alloc_.direct_ptr;
      mark_bisection((inertia *)&local_c8,&local_128,(Reals *)(local_1f8.items2content_ + 1),
                     &local_138,(Real)local_1f8.roots2items_[1].write_.shared_alloc_.direct_ptr,
                     &local_f8);
      pAVar5 = local_138.write_.shared_alloc_.alloc;
      local_208 = local_c8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_200 = local_c8.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((((ulong)local_c8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
           local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) && (entering_parallel == '\x01')) {
        ppvVar2 = &((local_c8.parent_comm_.
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        local_208 = (element_type *)
                    ((long)(local_c8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
      }
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
          local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_138.write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_1f8.items2content_[1].write_.shared_alloc_.alloc;
      _Var9._M_pi = local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (((ulong)local_1f8.items2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
          local_1f8.items2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_1f8.items2content_[1].write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_1f8.items2content_[1].write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
          _Var9._M_pi = local_128.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
        }
      }
    }
    else {
      local_f8.super_Few<double,_3>.array_[2] = (__dest->super_Few<double,_3>).array_[2];
      local_f8.super_Few<double,_3>.array_[0] = (__dest->super_Few<double,_3>).array_[0];
      local_f8.super_Few<double,_3>.array_[1] = (__dest->super_Few<double,_3>).array_[1];
      __src = __dest + 1;
      if (__src != pVVar4) {
        memmove(__dest,__src,(long)pVVar4 - (long)__src);
      }
      ppVVar1 = &(p_hints->axes).
                 super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + -1;
      local_148.write_.shared_alloc_.alloc =
           (Alloc *)(comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_148.write_.shared_alloc_.direct_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.write_.shared_alloc_.direct_ptr
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.write_.shared_alloc_.direct_ptr
          )->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_148.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.write_.shared_alloc_.direct_ptr
          )->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_148.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
        }
      }
      local_1f8.items2content_[0].write_.shared_alloc_.alloc =
           (p_coords->write_).shared_alloc_.alloc;
      if (((ulong)local_1f8.items2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
          local_1f8.items2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1f8.items2content_[0].write_.shared_alloc_.alloc =
               (Alloc *)((local_1f8.items2content_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_1f8.items2content_[0].write_.shared_alloc_.alloc)->use_count =
               (local_1f8.items2content_[0].write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_1f8.items2content_[0].write_.shared_alloc_.direct_ptr =
           (p_coords->write_).shared_alloc_.direct_ptr;
      local_158 = (p_masses->write_).shared_alloc_.alloc;
      if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_158 = (Alloc *)(local_158->size * 8 + 1);
        }
        else {
          local_158->use_count = local_158->use_count + 1;
        }
      }
      local_150 = (p_masses->write_).shared_alloc_.direct_ptr;
      axis_00.super_Few<double,_3>.array_[1] = local_f8.super_Few<double,_3>.array_[1];
      axis_00.super_Few<double,_3>.array_[0] = local_f8.super_Few<double,_3>.array_[0];
      axis_00.super_Few<double,_3>.array_[2] = local_f8.super_Few<double,_3>.array_[2];
      mark_bisection_given_axis
                (&local_c8.parent_comm_,&local_148,(Reals *)local_1f8.items2content_,
                 (Real)local_1f8.roots2items_[1].write_.shared_alloc_.direct_ptr,axis_00);
      pAVar5 = local_158;
      local_208 = local_c8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_200 = local_c8.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((((ulong)local_c8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
           local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) && (entering_parallel == '\x01')) {
        ppvVar2 = &((local_c8.parent_comm_.
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        local_208 = (element_type *)
                    ((long)(local_c8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
      }
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
        piVar3 = &local_158->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_158);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_1f8.items2content_[0].write_.shared_alloc_.alloc;
      _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_148.write_.shared_alloc_.direct_ptr;
      if (((ulong)local_1f8.items2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
          local_1f8.items2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_1f8.items2content_[0].write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_1f8.items2content_[0].write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
          _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_148.write_.shared_alloc_.direct_ptr;
        }
      }
    }
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_208;
    if (((ulong)local_208 & 7) == 0 && local_208 != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((long)local_208->library_ * 8 + 1);
      }
      else {
        ppvVar2 = &(local_208->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
      }
    }
    local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_200;
    bi_partition(&local_c8,&local_168,(Read<signed_char> *)(local_1f8.comm_ + 1));
    peVar6 = local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (((ulong)local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ppvVar2 = &((local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      if (*(int *)ppvVar2 == 0) {
        Alloc::~Alloc((Alloc *)local_1f8.comm_[1].
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        operator_delete(peVar6,0x48);
      }
    }
    if (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_coords->write_).shared_alloc_.alloc;
    if (((ulong)local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((long)(local_1f8.comm_[0].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->library_
              * 8 + 1);
      }
      else {
        ppvVar2 = &((local_1f8.comm_[0].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
      }
    }
    local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (p_coords->write_).shared_alloc_.direct_ptr;
    Dist::exch<double>(&local_1f8,(Read<double> *)&local_c8,(int)&local_1f8 + 0x70);
    pAVar5 = (p_coords->write_).shared_alloc_.alloc;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    peVar6 = local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (p_coords->write_).shared_alloc_.alloc =
         (Alloc *)local_1f8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (p_coords->write_).shared_alloc_.direct_ptr =
         local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((((ulong)local_1f8.parent_comm_.
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
         local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0) && (entering_parallel == '\x01')) {
      ppvVar2 = &((local_1f8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      (p_coords->write_).shared_alloc_.alloc =
           (Alloc *)((long)(local_1f8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
    }
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((ulong)local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ppvVar2 = &((local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      if (*(int *)ppvVar2 == 0) {
        Alloc::~Alloc((Alloc *)local_1f8.comm_[0].
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        operator_delete(peVar6,0x48);
      }
    }
    local_1f8.msgs2content_[1].write_.shared_alloc_.alloc = (p_masses->write_).shared_alloc_.alloc;
    if (((ulong)local_1f8.msgs2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.msgs2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f8.msgs2content_[1].write_.shared_alloc_.alloc =
             (Alloc *)((local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->use_count =
             (local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1f8.msgs2content_[1].write_.shared_alloc_.direct_ptr =
         (p_masses->write_).shared_alloc_.direct_ptr;
    Dist::exch<double>(&local_1f8,(Read<double> *)&local_c8,(int)&local_1f8 + 0x60);
    pAVar5 = (p_masses->write_).shared_alloc_.alloc;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_1f8.msgs2content_[1].write_.shared_alloc_.alloc;
    (p_masses->write_).shared_alloc_.alloc =
         (Alloc *)local_1f8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (p_masses->write_).shared_alloc_.direct_ptr =
         local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((((ulong)local_1f8.parent_comm_.
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
         local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0) && (entering_parallel == '\x01')) {
      ppvVar2 = &((local_1f8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      (p_masses->write_).shared_alloc_.alloc =
           (Alloc *)((long)(local_1f8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
    }
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((ulong)local_1f8.msgs2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.msgs2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_1f8.msgs2content_[1].write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    local_118.ranks.write_.shared_alloc_.alloc = (p_owners->ranks).write_.shared_alloc_.alloc;
    if (((ulong)local_118.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_118.ranks.write_.shared_alloc_.alloc =
             (Alloc *)((local_118.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_118.ranks.write_.shared_alloc_.alloc)->use_count =
             (local_118.ranks.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_118.ranks.write_.shared_alloc_.direct_ptr =
         (p_owners->ranks).write_.shared_alloc_.direct_ptr;
    local_118.idxs.write_.shared_alloc_.alloc = (p_owners->idxs).write_.shared_alloc_.alloc;
    if (((ulong)local_118.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_118.idxs.write_.shared_alloc_.alloc =
             (Alloc *)((local_118.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_118.idxs.write_.shared_alloc_.alloc)->use_count =
             (local_118.idxs.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_118.idxs.write_.shared_alloc_.direct_ptr =
         (p_owners->idxs).write_.shared_alloc_.direct_ptr;
    Dist::exch((Remotes *)&local_1f8,&local_c8,&local_118,1);
    Remotes::operator=(p_owners,(Remotes *)&local_1f8);
    if (((ulong)local_1f8.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_1f8.roots2items_[0].write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_1f8.roots2items_[0].write_.shared_alloc_.alloc);
        operator_delete(local_1f8.roots2items_[0].write_.shared_alloc_.alloc,0x48);
      }
    }
    peVar6 = local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((ulong)local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr & 7) == 0 &&
        local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      ppvVar2 = &((local_1f8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      if (*(int *)ppvVar2 == 0) {
        Alloc::~Alloc((Alloc *)local_1f8.parent_comm_.
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        operator_delete(peVar6,0x48);
      }
    }
    pAVar5 = local_118.idxs.write_.shared_alloc_.alloc;
    local_d0 = p_coords;
    if (((ulong)local_118.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_118.idxs.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_118.idxs.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_118.ranks.write_.shared_alloc_.alloc;
    local_d8 = p_masses;
    if (((ulong)local_118.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_118.ranks.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_118.ranks.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    uVar8 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if ((uVar8 & 1) != 0) {
      fail("assertion %s failed at %s +%d\n","a % b == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
           ,0x11a);
    }
    this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    IVar7 = Comm::rank(this);
    Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Comm::split((Comm *)&local_1f8,(I32)this,IVar7 / ((int)uVar8 >> 1));
    _Var9._M_pi = local_1f8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar6 = local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar6;
    (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var9._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.parent_comm_.
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    local_1f8.msgs2content_[0].write_.shared_alloc_.alloc =
         (Alloc *)(comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
      }
    }
    recursively_bisect((CommPtr *)local_1f8.msgs2content_,
                       (Real)local_1f8.roots2items_[1].write_.shared_alloc_.direct_ptr,local_d0,
                       local_d8,p_owners,p_hints);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::insert
              (&p_hints->axes,
               (p_hints->axes).
               super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
               super__Vector_impl_data._M_start,&local_f8);
    Dist::~Dist(&local_c8);
    if (((ulong)local_208 & 7) == 0 && local_208 != (element_type *)0x0) {
      ppvVar2 = &(local_208->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      if (*(int *)ppvVar2 == 0) {
        Alloc::~Alloc((Alloc *)local_208);
        operator_delete(local_208,0x48);
      }
    }
  }
  return;
}

Assistant:

void recursively_bisect(CommPtr comm, Real tolerance, Reals* p_coords,
    Reals* p_masses, Remotes* p_owners, Rib* p_hints) {
  auto& coords = *p_coords;
  auto& masses = *p_masses;
  auto& owners = *p_owners;
  auto& hints = *p_hints;
  if (comm->size() == 1) {
    return;
  }
  Vector<3> axis;
  Read<I8> marks;
  if (hints.axes.empty()) {
    marks = inertia::mark_bisection(comm, coords, masses, tolerance, axis);
  } else {
    axis = hints.axes.front();
    hints.axes.erase(hints.axes.begin());
    marks = inertia::mark_bisection_given_axis(
        comm, coords, masses, tolerance, axis);
  }
  auto dist = bi_partition(comm, marks);
  coords = dist.exch(coords, 3);
  masses = dist.exch(masses, 1);
  owners = dist.exch(owners, 1);
  auto halfsize = divide_no_remainder(comm->size(), 2);
  comm = comm->split(comm->rank() / halfsize, comm->rank() % halfsize);
  recursively_bisect(comm, tolerance, p_coords, p_masses, p_owners, p_hints);
  hints.axes.insert(hints.axes.begin(), axis);
}